

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<std::vector<double,std::allocator<double>>>::internalSetData<std::__cxx11::string>
          (Parameter<std::vector<double,std::allocator<double>>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  _Vector_base<double,_std::allocator<double>_> local_48;
  string local_30;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_30,(string *)data);
  bVar1 = ParameterTraits<std::vector<double,_std::allocator<double>_>_>::convert
                    (&local_30,(RepType *)&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    this[0x2a] = (Parameter<std::vector<double,std::allocator<double>>>)0x0;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(this + 0x30),
               (vector<double,_std::allocator<double>_> *)&local_48);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }